

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O1

void __thiscall
Class::Class(Class *this,Group *classGroup,Subject *classSubject,Room *classRoom,
            Teacher *classTeacher,Time *classTime)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  undefined4 uVar6;
  
  (this->group).id = classGroup->id;
  (this->group).name._M_dataplus._M_p = (pointer)&(this->group).name.field_2;
  pcVar3 = (classGroup->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->group).name,pcVar3,pcVar3 + (classGroup->name)._M_string_length);
  std::vector<Subject,_std::allocator<Subject>_>::vector
            (&(this->group).subjects,&classGroup->subjects);
  (this->group).size = classGroup->size;
  paVar2 = &(this->subject).name.field_2;
  (this->subject).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (classSubject->name)._M_dataplus._M_p;
  paVar1 = &(classSubject->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(classSubject->name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->subject).name.field_2 + 8) = uVar4;
  }
  else {
    (this->subject).name._M_dataplus._M_p = pcVar3;
    (this->subject).name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->subject).name._M_string_length = (classSubject->name)._M_string_length;
  (classSubject->name)._M_dataplus._M_p = (pointer)paVar1;
  (classSubject->name)._M_string_length = 0;
  (classSubject->name).field_2._M_local_buf[0] = '\0';
  (this->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_start =
       (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (classSubject->teachers).super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = *(undefined4 *)&classRoom->field_0x4;
  sVar5 = classRoom->capacity;
  (this->room).number = classRoom->number;
  *(undefined4 *)&(this->room).field_0x4 = uVar6;
  (this->room).capacity = sVar5;
  paVar1 = &(this->teacher).name.field_2;
  (this->teacher).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (classTeacher->name)._M_dataplus._M_p;
  paVar2 = &(classTeacher->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(classTeacher->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->teacher).name.field_2 + 8) = uVar4;
  }
  else {
    (this->teacher).name._M_dataplus._M_p = pcVar3;
    (this->teacher).name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->teacher).name._M_string_length = (classTeacher->name)._M_string_length;
  (classTeacher->name)._M_dataplus._M_p = (pointer)paVar2;
  (classTeacher->name)._M_string_length = 0;
  (classTeacher->name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->time).day.field_2;
  (this->time).day._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (classTime->day)._M_dataplus._M_p;
  paVar2 = &(classTime->day).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(classTime->day).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->time).day.field_2 + 8) = uVar4;
  }
  else {
    (this->time).day._M_dataplus._M_p = pcVar3;
    (this->time).day.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->time).day._M_string_length = (classTime->day)._M_string_length;
  (classTime->day)._M_dataplus._M_p = (pointer)paVar2;
  (classTime->day)._M_string_length = 0;
  (classTime->day).field_2._M_local_buf[0] = '\0';
  (this->time).number = classTime->number;
  return;
}

Assistant:

Class(Group classGroup,
          Subject classSubject,
          const Room& classRoom,
          Teacher classTeacher,
          Time classTime) :
            group(move(classGroup)),
            subject(move(classSubject)),
            room(classRoom),
            teacher(move(classTeacher)),
            time(move(classTime)) {}